

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O0

void __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::parseComment
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this)

{
  string<unsigned_long> local_30;
  int local_1c;
  unsigned_long *puStack_18;
  int count;
  unsigned_long *pCommentBegin;
  CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this_local;
  
  this->CurrentNodeType = EXN_COMMENT;
  this->P = this->P + 1;
  puStack_18 = this->P;
  local_1c = 1;
  while (local_1c != 0) {
    if (*this->P == 0x3e) {
      local_1c = local_1c + -1;
    }
    else if (*this->P == 0x3c) {
      local_1c = local_1c + 1;
    }
    this->P = this->P + 1;
  }
  this->P = this->P + -3;
  pCommentBegin = (unsigned_long *)this;
  core::string<unsigned_long>::string<unsigned_long>
            (&local_30,puStack_18 + 2,(int)((ulong)((long)this->P - (long)puStack_18) >> 3) + -2);
  core::string<unsigned_long>::operator=(&this->NodeName,&local_30);
  core::string<unsigned_long>::~string(&local_30);
  this->P = this->P + 3;
  return;
}

Assistant:

void parseComment()
	{
		CurrentNodeType = EXN_COMMENT;
		P += 1;

		char_type *pCommentBegin = P;

		int count = 1;

		// move until end of comment reached
		while(count)
		{
			if (*P == L'>')
				--count;
			else
			if (*P == L'<')
				++count;

			++P;
		}

		P -= 3;
		NodeName = core::string<char_type>(pCommentBegin+2, (int)(P - pCommentBegin-2));
		P += 3;
	}